

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::setMode(Create *this,CreateMode *mode)

{
  bool bVar1;
  ProtocolVersion PVar2;
  element_type *peVar3;
  ostream *poVar4;
  bool local_49;
  Opcode local_3c [4];
  byte local_29;
  Opcode local_28;
  Opcode OStack_24;
  bool ret;
  CreateMode *local_20;
  CreateMode *mode_local;
  Create *this_local;
  
  local_20 = mode;
  mode_local = (CreateMode *)this;
  PVar2 = RobotModel::getVersion(&this->model);
  if (PVar2 == V_1) {
    peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->serial);
    OStack_24 = OC_START;
    bVar1 = Serial::sendOpcode(peVar3,&stack0xffffffffffffffdc);
    local_49 = false;
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->serial);
      local_28 = OC_CONTROL;
      local_49 = Serial::sendOpcode(peVar3,&local_28);
    }
    if (((local_49 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  local_29 = 0;
  switch(*local_20) {
  case MODE_OFF:
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 == V_2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
      poVar4 = std::operator<<(poVar4,"protocol version 2 does not support turning robot off");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_29 = 0;
    }
    else {
      peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->serial);
      local_3c[3] = 0x85;
      local_29 = Serial::sendOpcode(peVar3,local_3c + 3);
    }
    break;
  case MODE_PASSIVE:
    peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->serial);
    local_3c[2] = 0x80;
    local_29 = Serial::sendOpcode(peVar3,local_3c + 2);
    break;
  case MODE_SAFE:
    PVar2 = RobotModel::getVersion(&this->model);
    if (V_1 < PVar2) {
      peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->serial);
      local_3c[1] = 0x83;
      local_29 = Serial::sendOpcode(peVar3,local_3c + 1);
    }
    break;
  case MODE_FULL:
    peVar3 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->serial);
    local_3c[0] = OC_FULL;
    local_29 = Serial::sendOpcode(peVar3,local_3c);
    break;
  default:
    poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
    poVar4 = std::operator<<(poVar4,"cannot set robot to mode \'");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_20);
    poVar4 = std::operator<<(poVar4,"\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_29 = 0;
  }
  if ((local_29 & 1) != 0) {
    this->mode = *local_20;
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool Create::setMode(const CreateMode& mode) {
    if (model.getVersion() == V_1){
      // Switch to safe mode (required for compatibility with V_1)
      if (!(serial->sendOpcode(OC_START) && serial->sendOpcode(OC_CONTROL))) return false;
    }
    bool ret = false;
    switch (mode) {
      case MODE_OFF:
        if (model.getVersion() == V_2) {
          CERR("[create::Create] ", "protocol version 2 does not support turning robot off");
          ret = false;
        } else {
          ret = serial->sendOpcode(OC_POWER);
        }
        break;
      case MODE_PASSIVE:
        ret = serial->sendOpcode(OC_START);
        break;
      case MODE_SAFE:
        if (model.getVersion() > V_1) {
          ret = serial->sendOpcode(OC_SAFE);
        }
        break;
      case MODE_FULL:
        ret = serial->sendOpcode(OC_FULL);
        break;
      default:
        CERR("[create::Create] ", "cannot set robot to mode '" << mode << "'");
        ret = false;
    }
    if (ret) {
      this->mode = mode;
    }
    return ret;
  }